

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DMDetector.cpp
# Opt level: O2

ResultPointsAndTransitions *
ZXing::DataMatrix::TransitionsBetween
          (ResultPointsAndTransitions *__return_storage_ptr__,BitMatrix *image,ResultPoint *from,
          ResultPoint *to)

{
  ulong uVar1;
  bool bVar2;
  bool bVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar10;
  undefined1 auVar9 [16];
  int iVar11;
  int iVar12;
  int iVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  
  iVar6 = (int)(from->super_PointF).x;
  iVar7 = (int)(from->super_PointF).y;
  iVar11 = (int)(to->super_PointF).x;
  iVar13 = (int)(to->super_PointF).y;
  iVar8 = iVar11 - iVar6 >> 0x1f;
  iVar10 = iVar13 - iVar7 >> 0x1f;
  uVar1 = CONCAT44(iVar13 - iVar7,iVar11 - iVar6) ^ CONCAT44(iVar10,iVar8);
  uVar14 = (int)uVar1 - iVar8;
  uVar16 = (int)(uVar1 >> 0x20) - iVar10;
  iVar12 = iVar13;
  uVar15 = uVar14;
  uVar17 = uVar16;
  iVar8 = iVar7;
  iVar10 = iVar6;
  if (uVar16 <= uVar14) {
    iVar12 = iVar11;
    iVar11 = iVar13;
    uVar15 = uVar16;
    uVar17 = uVar14;
    iVar8 = iVar6;
    iVar10 = iVar7;
  }
  iVar13 = -(uVar17 >> 1);
  auVar9._0_4_ = -(uint)(iVar8 < iVar12);
  auVar9._4_4_ = auVar9._0_4_;
  auVar9._8_4_ = -(uint)(iVar10 < iVar11);
  auVar9._12_4_ = -(uint)(iVar10 < iVar11);
  uVar4 = movmskpd(uVar16,auVar9);
  iVar5 = 0;
  bVar2 = BitMatrix::get(image,iVar6,iVar7);
  for (; iVar12 != iVar8; iVar8 = iVar8 + ((uVar4 & 1) - 1 | 1)) {
    iVar7 = iVar10;
    iVar6 = iVar8;
    if (uVar14 < uVar16) {
      iVar7 = iVar8;
      iVar6 = iVar10;
    }
    bVar3 = BitMatrix::get(image,iVar6,iVar7);
    iVar5 = iVar5 + (uint)(byte)(bVar2 ^ bVar3);
    if ((bVar2 ^ bVar3) == 0) {
      bVar3 = bVar2;
    }
    bVar2 = bVar3;
    bVar3 = SCARRY4(iVar13,uVar15);
    iVar13 = iVar13 + uVar15;
    if (iVar13 != 0 && bVar3 == iVar13 < 0) {
      if (iVar10 == iVar11) break;
      iVar10 = iVar10 + (-(uint)((uVar4 & 2) == 0) | 1);
      iVar13 = iVar13 - uVar17;
    }
  }
  __return_storage_ptr__->from = from;
  __return_storage_ptr__->to = to;
  __return_storage_ptr__->transitions = iVar5;
  return __return_storage_ptr__;
}

Assistant:

static ResultPointsAndTransitions TransitionsBetween(const BitMatrix& image, const ResultPoint& from,
													 const ResultPoint& to)
{
	// See QR Code Detector, sizeOfBlackWhiteBlackRun()
	int fromX = static_cast<int>(from.x());
	int fromY = static_cast<int>(from.y());
	int toX = static_cast<int>(to.x());
	int toY = static_cast<int>(to.y());
	bool steep = std::abs(toY - fromY) > std::abs(toX - fromX);
	if (steep) {
		std::swap(fromX, fromY);
		std::swap(toX, toY);
	}

	int dx = std::abs(toX - fromX);
	int dy = std::abs(toY - fromY);
	int error = -dx / 2;
	int ystep = fromY < toY ? 1 : -1;
	int xstep = fromX < toX ? 1 : -1;
	int transitions = 0;
	bool inBlack = image.get(steep ? fromY : fromX, steep ? fromX : fromY);
	for (int x = fromX, y = fromY; x != toX; x += xstep) {
		bool isBlack = image.get(steep ? y : x, steep ? x : y);
		if (isBlack != inBlack) {
			transitions++;
			inBlack = isBlack;
		}
		error += dy;
		if (error > 0) {
			if (y == toY) {
				break;
			}
			y += ystep;
			error -= dx;
		}
	}
	return ResultPointsAndTransitions{ &from, &to, transitions };
}